

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chaiscript_eval.hpp
# Opt level: O1

Boxed_Value __thiscall
chaiscript::eval::Equation_AST_Node<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_>
::eval_internal(Equation_AST_Node<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_>
                *this,Dispatch_State *t_ss)

{
  uint uVar1;
  Opers OVar2;
  Type_Conversions *pTVar3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var4;
  undefined8 this_00;
  bool bVar5;
  int iVar6;
  eval_error *peVar7;
  Dispatch_State *in_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  Boxed_Value *this_01;
  long lVar8;
  Boxed_Value BVar9;
  string_view t_name;
  string_view t_name_00;
  array<chaiscript::Boxed_Value,_2UL> params;
  string local_c8;
  reference_wrapper<chaiscript::detail::Dispatch_Engine> rStack_a8;
  undefined1 local_a0 [40];
  reference_wrapper<chaiscript::detail::Stack_Holder> local_78;
  reference_wrapper<const_chaiscript::Type_Conversions> local_70;
  Boxed_Value local_60;
  Boxed_Value local_50;
  Boxed_Value local_40;
  
  chaiscript::detail::Dispatch_Engine::new_function_call
            ((in_RDX->m_engine)._M_data,(in_RDX->m_stack_holder)._M_data,
             (in_RDX->m_conversions).m_saves._M_data);
  local_c8._M_dataplus._M_p = (pointer)t_ss;
  local_c8._M_string_length = (size_type)in_RDX;
  eval_internal::anon_class_16_2_3fe617c6::operator()
            ((array<chaiscript::Boxed_Value,_2UL> *)local_a0,(anon_class_16_2_3fe617c6 *)&local_c8);
  if ((((Type_Conversions *)(local_a0._0_8_ + 0x38))->m_mutex)._M_impl._M_rwlock.__size[1] == '\x01'
     ) {
    peVar7 = (eval_error *)__cxa_allocate_exception(0x90);
    local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_c8,"Error, cannot assign to temporary value.","");
    exception::eval_error::eval_error(peVar7,&local_c8);
    __cxa_throw(peVar7,&exception::eval_error::typeinfo,exception::eval_error::~eval_error);
  }
  uVar1 = (((shared_mutex *)local_a0._0_8_)->_M_impl)._M_rwlock.__data.__pad3;
  if ((uVar1 & 1) != 0) {
    peVar7 = (eval_error *)__cxa_allocate_exception(0x90);
    local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_c8,"Error, cannot assign to constant value.","");
    exception::eval_error::eval_error(peVar7,&local_c8);
    __cxa_throw(peVar7,&exception::eval_error::typeinfo,exception::eval_error::~eval_error);
  }
  OVar2 = *(Opers *)&t_ss[3].m_stack_holder._M_data;
  if (((uVar1 & 0x10) != 0 && OVar2 != invalid) &&
     (((((shared_mutex *)local_a0._16_8_)->_M_impl)._M_rwlock.__size[0x10] & 0x10U) != 0)) {
    local_70._M_data = (Type_Conversions *)(local_a0 + 0x10);
    local_a0._32_4_ = OVar2;
    local_78._M_data = (Stack_Holder *)local_a0;
    Boxed_Number::
    visit<chaiscript::Boxed_Number::oper(chaiscript::Operators::Opers,chaiscript::Boxed_Value_const&,chaiscript::Boxed_Value_const&)::_lambda(auto:1_const&)_1_&>
              ((Boxed_Number *)this,(Boxed_Value *)local_a0,
               (anon_class_24_3_1b4046b4 *)((long)local_a0 + 0x20));
    goto LAB_003829b2;
  }
  if (OVar2 == assign) {
    if ((uVar1 & 0x20) != 0) {
      pTVar3 = t_ss[2].m_conversions.m_conversions._M_data;
      if ((pTVar3 != (Type_Conversions *)t_ss[2].m_conversions.m_saves._M_data) &&
         ((lVar8 = (pTVar3->m_mutex)._M_impl._M_rwlock.__align, *(int *)(lVar8 + 8) == 0x22 ||
          ((*(long **)(lVar8 + 0x50) != *(long **)(lVar8 + 0x58) &&
           (*(int *)(**(long **)(lVar8 + 0x50) + 8) == 0x22)))))) {
        this_01 = &local_40;
        goto LAB_003828bd;
      }
      local_60.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr = (element_type *)local_a0._16_8_;
      local_60.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_a0._24_8_;
      local_a0._16_8_ = (Type_Conversions *)0x0;
      local_a0._24_8_ = (Conversion_Saves *)0x0;
      detail::clone_if_necessary
                ((detail *)&local_c8,&local_60,
                 (atomic_uint_fast32_t *)&t_ss[3].m_conversions.m_saves,in_RDX);
      this_00 = local_a0._24_8_;
      local_a0._24_8_ = local_c8._M_string_length;
      local_a0._16_8_ = local_c8._M_dataplus._M_p;
      local_c8._M_dataplus._M_p = (pointer)0x0;
      local_c8._M_string_length = 0;
      if ((Conversion_Saves *)this_00 != (Conversion_Saves *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this_00);
      }
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_c8._M_string_length !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_c8._M_string_length);
      }
      if ((Dispatch_State *)
          local_60.m_data.
          super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi != (Dispatch_State *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_60.m_data.
                   super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
      }
    }
    local_c8._M_string_length = (long)local_a0 + 0x20;
    t_name_00._M_str = &((t_ss->m_conversions).m_saves._M_data)->enabled;
    t_name_00._M_len = (size_t)(in_RDX->m_engine)._M_data;
    local_c8._M_dataplus._M_p = (pointer)local_a0;
    chaiscript::detail::Dispatch_Engine::call_function
              ((Dispatch_Engine *)this,t_name_00,
               (atomic_uint_fast32_t *)(t_ss->m_conversions).m_conversions._M_data,
               (Function_Params *)&t_ss[3].m_conversions,(Type_Conversions_State *)&local_c8);
  }
  else {
    iVar6 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &t_ss->m_conversions,":=");
    if (iVar6 != 0) {
      local_c8._M_string_length = (long)local_a0 + 0x20;
      t_name._M_str = &((t_ss->m_conversions).m_saves._M_data)->enabled;
      t_name._M_len = (size_t)(in_RDX->m_engine)._M_data;
      local_c8._M_dataplus._M_p = (pointer)local_a0;
      chaiscript::detail::Dispatch_Engine::call_function
                ((Dispatch_Engine *)this,t_name,
                 (atomic_uint_fast32_t *)(t_ss->m_conversions).m_conversions._M_data,
                 (Function_Params *)&t_ss[3].m_conversions,(Type_Conversions_State *)&local_c8);
      goto LAB_003829b2;
    }
    if ((*(uint *)((((shared_mutex *)local_a0._0_8_)->_M_impl)._M_rwlock.__size + 0x10) & 0x20) == 0
       ) {
      bVar5 = Type_Info::operator==((Type_Info *)local_a0._0_8_,(Type_Info *)local_a0._16_8_);
      if (!bVar5) {
        peVar7 = (eval_error *)__cxa_allocate_exception(0x90);
        local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_c8,"Mismatched types in equation","");
        exception::eval_error::eval_error(peVar7,&local_c8);
        __cxa_throw(peVar7,&exception::eval_error::typeinfo,exception::eval_error::~eval_error);
      }
    }
    this_01 = &local_50;
LAB_003828bd:
    Boxed_Value::assign(this_01,(Boxed_Value *)local_a0);
    p_Var4 = (this_01->m_data).
             super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi;
    if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var4);
    }
    (((Type_Conversions *)(local_a0._0_8_ + 0x38))->m_mutex)._M_impl._M_rwlock.__size[1] = '\0';
    (this->super_AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_>).
    super_AST_Node._vptr_AST_Node = (_func_int **)local_a0._16_8_;
    *(undefined8 *)
     &(this->super_AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_>).
      super_AST_Node.identifier = local_a0._24_8_;
    if ((Dispatch_State *)local_a0._24_8_ != (Dispatch_State *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        *(int *)&(((vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_> *)
                  (local_a0._24_8_ + 8))->
                 super__Vector_base<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_>
                 )._M_impl.super__Vector_impl_data._M_start =
             *(int *)&(((vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_> *
                        )(local_a0._24_8_ + 8))->
                      super__Vector_base<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_>
                      )._M_impl.super__Vector_impl_data._M_start + 1;
        UNLOCK();
      }
      else {
        *(int *)&(((vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_> *)
                  (local_a0._24_8_ + 8))->
                 super__Vector_base<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_>
                 )._M_impl.super__Vector_impl_data._M_start =
             *(int *)&(((vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_> *
                        )(local_a0._24_8_ + 8))->
                      super__Vector_base<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_>
                      )._M_impl.super__Vector_impl_data._M_start + 1;
      }
    }
  }
LAB_003829b2:
  lVar8 = 0x20;
  do {
    p_Var4 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)((long)&rStack_a8._M_data + lVar8);
    if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var4);
    }
    lVar8 = lVar8 + -0x10;
  } while (lVar8 != 0);
  chaiscript::detail::Dispatch_Engine::pop_function_call
            ((in_RDX->m_engine)._M_data,(in_RDX->m_stack_holder)._M_data,
             (in_RDX->m_conversions).m_saves._M_data);
  BVar9.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = extraout_RDX._M_pi;
  BVar9.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = (element_type *)this;
  return (Boxed_Value)
         BVar9.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

Boxed_Value eval_internal(const chaiscript::detail::Dispatch_State &t_ss) const override {
        chaiscript::eval::detail::Function_Push_Pop fpp(t_ss);

        auto params = [&]() {
          // The RHS *must* be evaluated before the LHS
          // consider `var range = range(x)`
          // if we declare the variable in scope first, then the name lookup fails
          // for the RHS
          auto rhs = this->children[1]->eval(t_ss);
          auto lhs = this->children[0]->eval(t_ss);
          std::array<Boxed_Value, 2> p{std::move(lhs), std::move(rhs)};
          return p;
        }();

        if (params[0].is_return_value()) {
          throw exception::eval_error("Error, cannot assign to temporary value.");
        } else if (params[0].is_const()) {
          throw exception::eval_error("Error, cannot assign to constant value.");
        }

        if (m_oper != Operators::Opers::invalid && params[0].get_type_info().is_arithmetic() && params[1].get_type_info().is_arithmetic()) {
          try {
            return Boxed_Number::do_oper(m_oper, params[0], params[1]);
          } catch (const std::exception &) {
            throw exception::eval_error("Error with unsupported arithmetic assignment operation.");
          }
        } else if (m_oper == Operators::Opers::assign) {
          try {
            if (params[0].is_undef()) {
              if (!this->children.empty()
                  && ((this->children[0]->identifier == AST_Node_Type::Reference)
                      || (!this->children[0]->children.empty() && this->children[0]->children[0]->identifier == AST_Node_Type::Reference)))

              {
                /// \todo This does not handle the case of an unassigned reference variable
                ///       being assigned outside of its declaration
                params[0].assign(params[1]);
                params[0].reset_return_value();
                return params[1];
              } else {
                params[1] = detail::clone_if_necessary(std::move(params[1]), m_clone_loc, t_ss);
              }
            }

            try {
              return t_ss->call_function(this->text, m_loc, Function_Params{params}, t_ss.conversions());
            } catch (const exception::dispatch_error &e) {
              throw exception::eval_error("Unable to find appropriate'" + this->text + "' operator.", e.parameters, e.functions, false, *t_ss);
            }
          } catch (const exception::dispatch_error &e) {
            throw exception::eval_error("Missing clone or copy constructor for right hand side of equation",
                                        e.parameters,
                                        e.functions,
                                        false,
                                        *t_ss);
          }
        } else if (this->text == ":=") {
          if (params[0].is_undef() || Boxed_Value::type_match(params[0], params[1])) {
            params[0].assign(params[1]);
            params[0].reset_return_value();
          } else {
            throw exception::eval_error("Mismatched types in equation");
          }
        } else {
          try {
            return t_ss->call_function(this->text, m_loc, Function_Params{params}, t_ss.conversions());
          } catch (const exception::dispatch_error &e) {
            throw exception::eval_error("Unable to find appropriate'" + this->text + "' operator.", e.parameters, e.functions, false, *t_ss);
          }
        }

        return params[1];
      }